

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O3

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,TempExpression *temp_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TempExpression *this_00;
  Temporary local_40;
  
  this_00 = (TempExpression *)operator_new(0x28);
  paVar1 = &local_40.name_.field_2;
  pcVar2 = (temp_expression->temporary_).name_._M_dataplus._M_p;
  local_40.name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,
             pcVar2 + (temp_expression->temporary_).name_._M_string_length);
  TempExpression::TempExpression(this_00,&local_40);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_ = (Expression *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.name_._M_dataplus._M_p,local_40.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void BlockFormerVisitor::Visit(TempExpression* temp_expression) {
  tos_value_.expression_ = new TempExpression(temp_expression->temporary_);
}